

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegen.cpp
# Opt level: O2

bool FilesAreDifferent(path *a,path *b)

{
  bool bVar1;
  uintmax_t uVar2;
  uintmax_t uVar3;
  bool bVar4;
  string l2;
  string l1;
  ifstream bs;
  ifstream as;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [520];
  undefined1 local_230 [520];
  
  uVar2 = boost::filesystem::file_size(a);
  uVar3 = boost::filesystem::file_size(b);
  bVar4 = true;
  if (uVar2 == uVar3) {
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_230,a);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_438,b);
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    local_458._M_string_length = 0;
    local_458.field_2._M_local_buf[0] = '\0';
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    local_478._M_string_length = 0;
    local_478.field_2._M_local_buf[0] = '\0';
    bVar4 = true;
    do {
      if (*(uint *)(*(_func_int **)(local_230._0_8_ + -0x18) + (long)(local_230 + 0x20)) != 0) {
        bVar4 = true;
        if ((*(uint *)(*(_func_int **)(local_230._0_8_ + -0x18) + (long)(local_230 + 0x20)) & 2) !=
            0) {
          bVar4 = ((byte)(*(_func_int **)(local_438._0_8_ + -0x18))[(long)(local_438 + 0x20)] & 2)
                  == 0;
        }
        break;
      }
      if (*(int *)(*(_func_int **)(local_438._0_8_ + -0x18) + (long)(local_438 + 0x20)) != 0) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_230,(string *)&local_458);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_438,(string *)&local_478);
      bVar1 = std::operator!=(&local_458,&local_478);
    } while (!bVar1);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_438);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_230);
  }
  return bVar4;
}

Assistant:

static bool FilesAreDifferent(const filesystem::path &a, const filesystem::path &b) {
    if (filesystem::file_size(a) != filesystem::file_size(b)) {
        return true;
    }
    streams::ifstream as(a), bs(b);
    std::string l1, l2;
    while (as.good() && bs.good()) {
        getline(as, l1);
        getline(bs, l2);
        if (l1 != l2) {
            return true;
        }
    }
    return !(as.eof() && bs.eof());
}